

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O2

NFA * __thiscall NFA::NFA_concatenate(NFA *this,NFA *a,NFA *b,int type)

{
  ulong in_RAX;
  NFA *pNVar1;
  Node *this_00;
  Node *this_01;
  mapped_type *pmVar2;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pNVar1 = (NFA *)operator_new(0x10);
  this_00 = (Node *)operator_new(0x40);
  Node::Node(this_00,type);
  this_01 = (Node *)operator_new(0x40);
  Node::Node(this_01,type);
  pNVar1->start = this_00;
  pNVar1->end = this_01;
  uStack_38 = uStack_38 & 0xffffffffffffff;
  pmVar2 = std::
           map<char,_std::vector<Node_*,_std::allocator<Node_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<Node_*,_std::allocator<Node_*>_>_>_>_>
           ::operator[]((map<char,_std::vector<Node_*,_std::allocator<Node_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<Node_*,_std::allocator<Node_*>_>_>_>_>
                         *)this_00,(key_type *)((long)&uStack_38 + 7));
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(pmVar2,&a->start);
  uStack_38._0_7_ = (uint7)(uint6)uStack_38;
  pmVar2 = std::
           map<char,_std::vector<Node_*,_std::allocator<Node_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<Node_*,_std::allocator<Node_*>_>_>_>_>
           ::operator[](&b->end->adjacent,(key_type *)((long)&uStack_38 + 6));
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(pmVar2,&pNVar1->end);
  uStack_38._0_6_ = (uint6)(uint5)uStack_38;
  pmVar2 = std::
           map<char,_std::vector<Node_*,_std::allocator<Node_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<Node_*,_std::allocator<Node_*>_>_>_>_>
           ::operator[](&a->end->adjacent,(key_type *)((long)&uStack_38 + 5));
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(pmVar2,&b->start);
  a->end->isAccepting = false;
  b->end->isAccepting = false;
  pNVar1->end->isAccepting = true;
  return pNVar1;
}

Assistant:

NFA *NFA::NFA_concatenate(NFA *a, NFA *b, int type) {
    NFA *result = new NFA(new Node(type), new Node(type));
    result->start->adjacent['\0'].push_back(a->start);
    b->end->adjacent['\0'].push_back(result->end);
    a->end->adjacent['\0'].push_back(b->start);
    a->end->isAccepting = false;
    b->end->isAccepting = false;
    result->end->isAccepting = true;
    return result;
}